

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest20_21::subroutineUniformSet::operator!=
          (subroutineUniformSet *this,subroutineUniformSet *arg)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((arg->m_vertex_shader_stage == this->m_vertex_shader_stage) &&
       (arg->m_tesselation_control_shader_stage == this->m_tesselation_control_shader_stage)) &&
      (arg->m_tesselation_evaluation_shader_stage == this->m_tesselation_evaluation_shader_stage))
     && (arg->m_geometry_shader_stage == this->m_geometry_shader_stage)) {
    bVar1 = arg->m_fragment_shader_stage != this->m_fragment_shader_stage;
  }
  return bVar1;
}

Assistant:

bool FunctionalTest20_21::subroutineUniformSet::operator!=(const subroutineUniformSet& arg) const
{
	if ((arg.m_vertex_shader_stage != m_vertex_shader_stage) ||
		(arg.m_tesselation_control_shader_stage != m_tesselation_control_shader_stage) ||
		(arg.m_tesselation_evaluation_shader_stage != m_tesselation_evaluation_shader_stage) ||
		(arg.m_geometry_shader_stage != m_geometry_shader_stage) ||
		(arg.m_fragment_shader_stage != m_fragment_shader_stage))
	{
		return true;
	}

	return false;
}